

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O3

bool __thiscall lexical::analyse_annotation(lexical *this,iterator *it,Meta *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined8 uVar3;
  char *ch;
  Token t;
  string buf;
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_78;
  Symbol local_58;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  ch = it->_M_current;
  uVar3 = 0;
  bVar2 = false;
  if (ch != (m->end)._M_current) {
    do {
      switch(uVar3) {
      case 0:
        uVar3 = 1;
        break;
      case 1:
        bVar2 = sutil::is_key(ch,true);
        if (!bVar2) {
          local_a8._0_8_ = local_a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a8,anon_var_dwarf_32021,anon_var_dwarf_32021 + 0x21);
          error(this,it,m,(string *)local_a8);
          if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
            operator_delete((void *)local_a8._0_8_);
          }
          goto LAB_0010b1ff;
        }
        ch = it->_M_current + -1;
        it->_M_current = ch;
LAB_0010b1e1:
        uVar3 = 2;
        break;
      case 2:
        bVar2 = sutil::is_key(ch,false);
        if (bVar2) {
          std::__cxx11::string::push_back((char)&local_78);
          ch = it->_M_current;
          goto LAB_0010b1e1;
        }
        ch = it->_M_current + -1;
        it->_M_current = ch;
        uVar3 = 3;
        break;
      case 3:
        Token::Token((Token *)local_a8,m->line,m->column,8,&local_78);
        std::vector<Token,_std::allocator<Token>_>::push_back(&this->tokens,(value_type *)local_a8);
        paVar1 = &local_58.name.field_2;
        local_58.type = local_a8._8_4_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._16_8_ == &local_88) {
          local_58.name.field_2._8_8_ = local_88._8_8_;
          local_58.name._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_58.name._M_dataplus._M_p = (pointer)local_a8._16_8_;
        }
        local_58.name._M_string_length = local_a8._24_8_;
        local_a8._24_8_ = 0;
        local_88._M_local_buf[0] = '\0';
        local_a8._16_8_ = &local_88;
        std::
        _Rb_tree<Symbol,_Symbol,_std::_Identity<Symbol>,_std::less<Symbol>,_std::allocator<Symbol>_>
        ::_M_insert_unique<Symbol>(&(this->symbols)._M_t,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.name._M_dataplus._M_p != paVar1) {
          operator_delete(local_58.name._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._16_8_ != &local_88) {
          operator_delete((void *)local_a8._16_8_);
        }
        bVar2 = true;
        goto LAB_0010b201;
      }
      ch = ch + 1;
      it->_M_current = ch;
    } while (ch != (m->end)._M_current);
LAB_0010b1ff:
    bVar2 = false;
  }
LAB_0010b201:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool lexical::analyse_annotation(string::iterator &it, const Meta &m) {
    int state = 0;
    string buf;
    while (it != m.end) {
        switch (state) {
            case 0: {
                state = 1;
                break;
            }
            case 1: {
                if (!sutil::is_key(*it, true)){
                    error(it, m, "注解的不能以非字母开头");
                    return false;
                }
                --it;
                state = 2;
                break;
            }
            case 2: {
                if (sutil::is_key(*it))buf.push_back(*it);
                else {
                    --it;
                    state = 3;
                }
                break;
            }
            case 3: {
                Token t(m.line, m.column, Token::ANNOTATION, buf);
                tokens.push_back(t);
                symbols.insert(Symbol(t.type, t.name));
                return true;
            }
        }
        ++it;
    }
    return false;
}